

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# skip_list.c
# Opt level: O0

ion_status_t sl_update(ion_skiplist_t *skiplist,ion_key_t key,ion_value_t value)

{
  ion_key_size_t iVar1;
  int iVar2;
  char cVar3;
  ion_status_t iVar4;
  bool bVar5;
  ion_err_t local_48;
  ion_sl_node_t *local_40;
  ion_sl_node_t *cursor;
  ion_value_size_t value_size;
  ion_key_size_t key_size;
  ion_value_t value_local;
  ion_key_t key_local;
  ion_skiplist_t *skiplist_local;
  ion_status_t status;
  
  value_size = CONCAT31(value_size._1_3_,0x12);
  skiplist_local = (ion_skiplist_t *)(ulong)(uint)value_size;
  iVar1 = (skiplist->super).record.key_size;
  iVar2 = (skiplist->super).record.value_size;
  local_40 = sl_find_node(skiplist,key);
  if ((local_40->key == (ion_key_t)0x0) ||
     (cVar3 = (*(skiplist->super).compare)(local_40->key,key,iVar1), cVar3 != '\0')) {
    iVar4 = sl_insert(skiplist,key,value);
    local_48 = iVar4.error;
    skiplist_local = (ion_skiplist_t *)CONCAT44(1,CONCAT31(value_size._1_3_,local_48));
  }
  else {
    while( true ) {
      bVar5 = false;
      if (local_40 != (ion_sl_node_t *)0x0) {
        cVar3 = (*(skiplist->super).compare)(local_40->key,key,(skiplist->super).record.key_size);
        bVar5 = cVar3 == '\0';
      }
      if (!bVar5) break;
      memcpy(local_40->value,value,(long)iVar2);
      local_40 = *local_40->next;
      skiplist_local = (ion_skiplist_t *)CONCAT44(skiplist_local._4_4_ + 1,skiplist_local._0_4_);
    }
    skiplist_local = (ion_skiplist_t *)((ulong)skiplist_local & 0xffffffffffffff00);
  }
  return (ion_status_t)skiplist_local;
}

Assistant:

ion_status_t
sl_update(
	ion_skiplist_t	*skiplist,
	ion_key_t		key,
	ion_value_t		value
) {
	ion_status_t status;

	status = ION_STATUS_INITIALIZE;

	ion_key_size_t		key_size	= skiplist->super.record.key_size;
	ion_value_size_t	value_size	= skiplist->super.record.value_size;
	ion_sl_node_t		*cursor		= sl_find_node(skiplist, key);

	/* If the key doesn't exist in the skiplist... */
	if ((NULL == cursor->key) || (skiplist->super.compare(cursor->key, key, key_size) != 0)) {
		/* Insert it. */
		status.error	= sl_insert(skiplist, key, value).error;
		status.count	= 1;
		return status;
	}

	/* Otherwise, the key exists and now we have the node to update. */

	/* While the cursor still has the same key as the target key... */
	while (NULL != cursor && skiplist->super.compare(cursor->key, key, skiplist->super.record.key_size) == 0) {
		/* Update the value, and then move on to the next node. */
		memcpy(cursor->value, value, value_size);
		cursor = cursor->next[0];
		status.count++;
	}

	status.error = err_ok;
	return status;
}